

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O2

void __thiscall BamTools::SplitTool::~SplitTool(SplitTool *this)

{
  ~SplitTool(this);
  operator_delete(this);
  return;
}

Assistant:

SplitTool::~SplitTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}